

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O0

QJsonObject __thiscall PropertyDef::toJson(PropertyDef *this)

{
  long lVar1;
  QLatin1StringView key;
  QLatin1StringView key_00;
  QLatin1StringView key_01;
  QLatin1StringView key_02;
  QLatin1StringView key_03;
  QLatin1StringView key_04;
  QByteArray *in_RSI;
  QExplicitlySharedDataPointer<QCborContainerPrivate> in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  QJsonObject *prop;
  anon_class_8_1_89905061 jsonifyBoolOrString;
  anon_class_8_1_89905061 jsonify;
  undefined4 in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  QCborContainerPrivate *member;
  undefined1 in_stack_fffffffffffffe18 [16];
  char *in_stack_fffffffffffffe30;
  char *pcVar3;
  qsizetype in_stack_fffffffffffffe38;
  char *pcVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  member = (QCborContainerPrivate *)in_RDI.d.ptr;
  QJsonObject::QJsonObject((QJsonObject *)0x15ab0d);
  QString::fromUtf8<void>((QByteArray *)in_RDI.d.ptr);
  QJsonValue::QJsonValue
            ((QJsonValue *)in_RDI.d.ptr,
             (QString *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  Qt::Literals::StringLiterals::operator____L1((char *)member,(size_t)in_RDI.d.ptr);
  QVar2.m_size = in_stack_fffffffffffffe38;
  QVar2.m_data = in_stack_fffffffffffffe30;
  QJsonObject::operator[]((QJsonObject *)member,QVar2);
  QJsonValueRef::operator=((QJsonValueRef *)in_RSI,(QJsonValue *)member);
  QJsonValue::~QJsonValue((QJsonValue *)0x15aba1);
  QString::~QString((QString *)0x15abae);
  QString::fromUtf8<void>((QByteArray *)in_RDI.d.ptr);
  QJsonValue::QJsonValue
            ((QJsonValue *)in_RDI.d.ptr,
             (QString *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  Qt::Literals::StringLiterals::operator____L1((char *)member,(size_t)in_RDI.d.ptr);
  key.m_size = in_stack_fffffffffffffe38;
  key.m_data = in_stack_fffffffffffffe30;
  QJsonObject::operator[]((QJsonObject *)member,key);
  QJsonValueRef::operator=((QJsonValueRef *)in_RSI,(QJsonValue *)member);
  QJsonValue::~QJsonValue((QJsonValue *)0x15ac3a);
  QString::~QString((QString *)0x15ac47);
  toJson::anon_class_8_1_89905061::operator()
            (in_stack_fffffffffffffe18._0_8_,(char *)in_RSI,(QByteArray *)member);
  toJson::anon_class_8_1_89905061::operator()
            (in_stack_fffffffffffffe18._0_8_,(char *)in_RSI,(QByteArray *)member);
  toJson::anon_class_8_1_89905061::operator()
            (in_stack_fffffffffffffe18._0_8_,(char *)in_RSI,(QByteArray *)member);
  toJson::anon_class_8_1_89905061::operator()
            (in_stack_fffffffffffffe18._0_8_,(char *)in_RSI,(QByteArray *)member);
  toJson::anon_class_8_1_89905061::operator()
            (in_stack_fffffffffffffe18._0_8_,(char *)in_RSI,(QByteArray *)member);
  toJson::anon_class_8_1_89905061::operator()
            (in_stack_fffffffffffffe18._0_8_,(char *)in_RSI,(QByteArray *)member);
  toJson::anon_class_8_1_89905061::operator()
            (in_stack_fffffffffffffe18._0_8_,(char *)in_RSI,(QByteArray *)member);
  toJson::anon_class_8_1_89905061::operator()
            (in_stack_fffffffffffffe18._8_8_,in_stack_fffffffffffffe18._0_8_,in_RSI);
  toJson::anon_class_8_1_89905061::operator()
            (in_stack_fffffffffffffe18._8_8_,in_stack_fffffffffffffe18._0_8_,in_RSI);
  toJson::anon_class_8_1_89905061::operator()
            (in_stack_fffffffffffffe18._8_8_,in_stack_fffffffffffffe18._0_8_,in_RSI);
  toJson::anon_class_8_1_89905061::operator()
            (in_stack_fffffffffffffe18._8_8_,in_stack_fffffffffffffe18._0_8_,in_RSI);
  QJsonValue::QJsonValue
            ((QJsonValue *)in_RDI.d.ptr,SUB41((uint)in_stack_fffffffffffffdfc >> 0x18,0));
  Qt::Literals::StringLiterals::operator____L1((char *)member,(size_t)in_RDI.d.ptr);
  key_00.m_size = in_stack_fffffffffffffe38;
  key_00.m_data = in_stack_fffffffffffffe30;
  QJsonObject::operator[]((QJsonObject *)member,key_00);
  QJsonValueRef::operator=((QJsonValueRef *)in_RSI,(QJsonValue *)member);
  QJsonValue::~QJsonValue((QJsonValue *)0x15ae51);
  QJsonValue::QJsonValue
            ((QJsonValue *)in_RDI.d.ptr,SUB41((uint)in_stack_fffffffffffffdfc >> 0x18,0));
  Qt::Literals::StringLiterals::operator____L1((char *)member,(size_t)in_RDI.d.ptr);
  key_01.m_size = in_stack_fffffffffffffe38;
  key_01.m_data = in_stack_fffffffffffffe30;
  QJsonObject::operator[]((QJsonObject *)member,key_01);
  QJsonValueRef::operator=((QJsonValueRef *)in_RSI,(QJsonValue *)member);
  QJsonValue::~QJsonValue((QJsonValue *)0x15aecf);
  QJsonValue::QJsonValue
            ((QJsonValue *)in_RDI.d.ptr,SUB41((uint)in_stack_fffffffffffffdfc >> 0x18,0));
  QVar2 = Qt::Literals::StringLiterals::operator____L1((char *)member,(size_t)in_RDI.d.ptr);
  pcVar4 = QVar2.m_data;
  key_02.m_size = (qsizetype)pcVar4;
  key_02.m_data = in_stack_fffffffffffffe30;
  QJsonObject::operator[]((QJsonObject *)member,key_02);
  QJsonValueRef::operator=((QJsonValueRef *)in_RSI,(QJsonValue *)member);
  QJsonValue::~QJsonValue((QJsonValue *)0x15af4d);
  QJsonValue::QJsonValue((QJsonValue *)in_RDI.d.ptr,in_stack_fffffffffffffdfc);
  QVar2 = Qt::Literals::StringLiterals::operator____L1((char *)member,(size_t)in_RDI.d.ptr);
  pcVar3 = (char *)QVar2.m_size;
  key_03.m_size = (qsizetype)pcVar4;
  key_03.m_data = pcVar3;
  QJsonObject::operator[]((QJsonObject *)member,key_03);
  QJsonValueRef::operator=((QJsonValueRef *)in_RSI,(QJsonValue *)member);
  QJsonValue::~QJsonValue((QJsonValue *)0x15afc6);
  if (0 < *(int *)&in_RSI[0xd].d.ptr) {
    QJsonValue::QJsonValue((QJsonValue *)in_RDI.d.ptr,in_stack_fffffffffffffdfc);
    Qt::Literals::StringLiterals::operator____L1((char *)member,(size_t)in_RDI.d.ptr);
    key_04.m_size = (qsizetype)pcVar4;
    key_04.m_data = pcVar3;
    QJsonObject::operator[]((QJsonObject *)member,key_04);
    QJsonValueRef::operator=((QJsonValueRef *)in_RSI,(QJsonValue *)member);
    QJsonValue::~QJsonValue((QJsonValue *)0x15b04d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
         (QExplicitlySharedDataPointer<QCborContainerPrivate>)in_RDI.d.ptr;
}

Assistant:

QJsonObject PropertyDef::toJson() const
{
    QJsonObject prop;
    prop["name"_L1] = QString::fromUtf8(name);
    prop["type"_L1] = QString::fromUtf8(type);

    const auto jsonify = [&prop](const char *str, const QByteArray &member) {
        if (!member.isEmpty())
            prop[QLatin1StringView(str)] = QString::fromUtf8(member);
    };

    jsonify("member", member);
    jsonify("read", read);
    jsonify("write", write);
    jsonify("bindable", bind);
    jsonify("reset", reset);
    jsonify("notify", notify);
    jsonify("privateClass", inPrivateClass);

    const auto jsonifyBoolOrString = [&prop](const char *str, const QByteArray &boolOrString) {
        QJsonValue value;
        if (boolOrString == "true")
            value = true;
        else if (boolOrString == "false")
            value = false;
        else
            value = QString::fromUtf8(boolOrString); // function name to query at run-time
        prop[QLatin1StringView(str)] = value;
    };

    jsonifyBoolOrString("designable", designable);
    jsonifyBoolOrString("scriptable", scriptable);
    jsonifyBoolOrString("stored", stored);
    jsonifyBoolOrString("user", user);

    prop["constant"_L1] = constant;
    prop["final"_L1] = final;
    prop["required"_L1] = required;
    prop["index"_L1] = relativeIndex;
    if (revision > 0)
        prop["revision"_L1] = revision;

    return prop;
}